

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.h
# Opt level: O3

void __thiscall Basic_Longer_Test::TestBody(Basic_Longer_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined1 local_188 [8];
  BigNumber num_1;
  BigNumber num_2;
  BigNumber num_3;
  BigNumber num_4;
  string numStr_1;
  string numStr_3;
  string numStr_2;
  string numStr_4;
  undefined1 local_58 [16];
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  num_4._32_8_ = &numStr_1._M_string_length;
  numStr_1._M_dataplus._M_p = (pointer)0x0;
  numStr_1._M_string_length._0_1_ = 0;
  numStr_3.field_2._8_8_ = &numStr_2._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&numStr_3.field_2 + 8),"-","");
  numStr_1.field_2._8_8_ = &numStr_3._M_string_length;
  numStr_3._M_dataplus._M_p = (pointer)0x0;
  numStr_3._M_string_length._0_1_ = 0;
  numStr_2.field_2._8_8_ = &numStr_4._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&numStr_2.field_2 + 8),"-","");
  iVar2 = 0x10000;
  do {
    std::__cxx11::string::push_back((char)&num_4 + ' ');
    std::__cxx11::string::push_back((char)&numStr_3 + '\x18');
    std::__cxx11::string::push_back((char)&numStr_1 + '\x18');
    std::__cxx11::string::push_back((char)&numStr_2 + '\x18');
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  BigNumber::BigNumber((BigNumber *)local_188,(string *)&num_4.m_symbol);
  BigNumber::BigNumber((BigNumber *)&num_1.m_symbol,(string *)((long)&numStr_3.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)((long)&numStr_1.field_2 + 8));
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)((long)&numStr_2.field_2 + 8));
  BigNumber::toString_abi_cxx11_((string *)((long)&numStr_4.field_2 + 8),(BigNumber *)local_188);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_1","num_1.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_4.m_symbol,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_4.field_2 + 8));
  if ((undefined1 *)numStr_4.field_2._8_8_ != local_58) {
    operator_delete((void *)numStr_4.field_2._8_8_);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&numStr_4.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)((long)&numStr_4.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (numStr_4.field_2._8_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (numStr_4.field_2._8_8_ != 0)) {
        (**(code **)(*(long *)numStr_4.field_2._8_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_
            ((string *)((long)&numStr_4.field_2 + 8),(BigNumber *)&num_1.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_2","num_2.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_3.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_4.field_2 + 8));
  if ((undefined1 *)numStr_4.field_2._8_8_ != local_58) {
    operator_delete((void *)numStr_4.field_2._8_8_);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&numStr_4.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)((long)&numStr_4.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (numStr_4.field_2._8_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (numStr_4.field_2._8_8_ != 0)) {
        (**(code **)(*(long *)numStr_4.field_2._8_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_
            ((string *)((long)&numStr_4.field_2 + 8),(BigNumber *)&num_2.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_3","num_3.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_1.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_4.field_2 + 8));
  if ((undefined1 *)numStr_4.field_2._8_8_ != local_58) {
    operator_delete((void *)numStr_4.field_2._8_8_);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&numStr_4.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)((long)&numStr_4.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (numStr_4.field_2._8_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (numStr_4.field_2._8_8_ != 0)) {
        (**(code **)(*(long *)numStr_4.field_2._8_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_
            ((string *)((long)&numStr_4.field_2 + 8),(BigNumber *)&num_3.m_symbol);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_48,"numStr_4","num_4.toString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_2.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&numStr_4.field_2 + 8));
  if ((undefined1 *)numStr_4.field_2._8_8_ != local_58) {
    operator_delete((void *)numStr_4.field_2._8_8_);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&numStr_4.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/basic.h"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)((long)&numStr_4.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (numStr_4.field_2._8_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (numStr_4.field_2._8_8_ != 0)) {
        (**(code **)(*(long *)numStr_4.field_2._8_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_1.m_symbol);
  BigNumber::~BigNumber((BigNumber *)local_188);
  if ((size_type *)numStr_2.field_2._8_8_ != &numStr_4._M_string_length) {
    operator_delete((void *)numStr_2.field_2._8_8_);
  }
  if ((size_type *)numStr_1.field_2._8_8_ != &numStr_3._M_string_length) {
    operator_delete((void *)numStr_1.field_2._8_8_);
  }
  if ((size_type *)numStr_3.field_2._8_8_ != &numStr_2._M_string_length) {
    operator_delete((void *)numStr_3.field_2._8_8_);
  }
  if ((size_type *)num_4._32_8_ != &numStr_1._M_string_length) {
    operator_delete((void *)num_4._32_8_);
  }
  return;
}

Assistant:

TEST(Basic, Longer)
{
    std::string numStr_1, numStr_2 = "-", numStr_3, numStr_4 = "-";
    for (int i = 1; i <= 65536; i++)
    {
        numStr_1 += (i % 9) + '0';
        numStr_2 += (i % 7) + '0';
        numStr_3 += (i % 5) + '0';
        numStr_4 += (i % 3) + '0';
    }
    BigNumber num_1 = numStr_1;
    BigNumber num_2 = numStr_2;
    BigNumber num_3 = numStr_3;
    BigNumber num_4 = numStr_4;
    EXPECT_EQ(numStr_1, num_1.toString());
    EXPECT_EQ(numStr_2, num_2.toString());
    EXPECT_EQ(numStr_3, num_3.toString());
    EXPECT_EQ(numStr_4, num_4.toString());
}